

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void out_init(void)

{
  outflag = '\x01';
  outcnt = '\0';
  hidout = '\0';
  out_init_std((out_stream_info *)0x27d782);
  out_init_log((out_stream_info *)0x27d78e);
  return;
}

Assistant:

void out_init()
{
    /* not yet hiding output */
    outflag = 1;
    outcnt = 0;
    hidout = 0;

    /* initialize the standard display stream */
    out_init_std(&G_std_disp);

    /* initialize the log file stream */
    out_init_log(&G_log_disp);
}